

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_CustomModel_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0074a068 == '\x01') {
    DAT_0074a068 = '\0';
    (*(code *)*_CustomModel_CustomModelParamValue_default_instance_)();
  }
  if (DAT_0074a120 == '\x01') {
    DAT_0074a120 = 0;
    (*(code *)*_CustomModel_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _CustomModel_CustomModelParamValue_default_instance_.Shutdown();
  _CustomModel_default_instance_.Shutdown();
}